

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_matrix.cpp
# Opt level: O2

void __thiscall VSMatrix::multMatrix(VSMatrix *this,FLOATTYPE *aMatrix)

{
  int i;
  long lVar1;
  FLOATTYPE *pFVar2;
  FLOATTYPE *pFVar3;
  int j;
  long lVar4;
  long lVar5;
  float fVar6;
  FLOATTYPE res [16];
  
  lVar1 = 0;
  pFVar2 = this->mMatrix;
  for (; lVar1 != 4; lVar1 = lVar1 + 1) {
    pFVar3 = aMatrix;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      fVar6 = 0.0;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
        fVar6 = fVar6 + *(float *)((long)pFVar3 + lVar5) * pFVar2[lVar5];
      }
      res[lVar1 + lVar4 * 4] = fVar6;
      pFVar3 = pFVar3 + 4;
    }
    pFVar2 = pFVar2 + 1;
  }
  *(undefined8 *)(this->mMatrix + 0xc) = res._48_8_;
  *(undefined8 *)(this->mMatrix + 0xe) = res._56_8_;
  *(undefined8 *)(this->mMatrix + 8) = res._32_8_;
  *(undefined8 *)(this->mMatrix + 10) = res._40_8_;
  *(undefined8 *)(this->mMatrix + 4) = res._16_8_;
  *(undefined8 *)(this->mMatrix + 6) = res._24_8_;
  *(undefined8 *)this->mMatrix = res._0_8_;
  *(undefined8 *)(this->mMatrix + 2) = res._8_8_;
  return;
}

Assistant:

void 
VSMatrix::multMatrix(const FLOATTYPE *aMatrix)
{
	
	FLOATTYPE res[16];

	for (int i = 0; i < 4; ++i) 
	{
		for (int j = 0; j < 4; ++j) 
		{
			res[j*4 + i] = 0.0f;
			for (int k = 0; k < 4; ++k) 
			{
				res[j*4 + i] += mMatrix[k*4 + i] * aMatrix[j*4 + k]; 
			}
		}
	}
	memcpy(mMatrix, res, 16 * sizeof(FLOATTYPE));
}